

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeMergeEngineInit(SortSubtask *pTask,MergeEngine *pMerger,int eMode)

{
  PmaReader *pPVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int local_3c;
  SortSubtask *local_38;
  
  iVar9 = pMerger->nTree;
  lVar4 = (long)iVar9;
  pMerger->pTask = pTask;
  local_38 = pTask;
  if (0 < lVar4) {
    lVar8 = 0;
    do {
      iVar9 = iVar9 + -1;
      if (eMode == 2) {
        iVar2 = vdbePmaReaderNext(pMerger->aReadr + iVar9);
      }
      else {
        iVar2 = vdbePmaReaderIncrInit((PmaReader *)((long)&pMerger->aReadr->iReadOff + lVar8),0);
      }
      if (iVar2 != 0) {
        return iVar2;
      }
      lVar8 = lVar8 + 0x50;
    } while (lVar4 * 0x50 != lVar8);
    iVar9 = pMerger->nTree;
    if (1 < (long)iVar9) {
      iVar2 = iVar9 * 2;
      uVar6 = (long)iVar9 + 1;
      do {
        iVar2 = iVar2 + -2;
        uVar7 = uVar6 - 1;
        iVar9 = pMerger->nTree / 2;
        if ((long)iVar9 < (long)uVar7) {
          iVar5 = iVar2 + iVar9 * -2;
          iVar9 = iVar5 + 1;
        }
        else {
          iVar5 = pMerger->aTree[uVar6 * 2 + -4];
          iVar9 = pMerger->aTree[uVar6 * 2 + -3];
        }
        pPVar1 = pMerger->aReadr;
        iVar10 = iVar9;
        if ((pPVar1[iVar5].pFd != (sqlite3_file *)0x0) &&
           (iVar10 = iVar5, pPVar1[iVar9].pFd != (sqlite3_file *)0x0)) {
          local_3c = 0;
          iVar3 = (*pMerger->pTask->xCompare)
                            (pMerger->pTask,&local_3c,pPVar1[iVar5].aKey,pPVar1[iVar5].nKey,
                             pPVar1[iVar9].aKey,pPVar1[iVar9].nKey);
          iVar10 = iVar9;
          if (iVar3 < 1) {
            iVar10 = iVar5;
          }
        }
        pMerger->aTree[uVar6 - 2] = iVar10;
        uVar6 = uVar7;
      } while (2 < uVar7);
    }
  }
  return (uint)local_38->pUnpacked->errCode;
}

Assistant:

static int vdbeMergeEngineInit(
  SortSubtask *pTask,             /* Thread that will run pMerger */
  MergeEngine *pMerger,           /* MergeEngine to initialize */
  int eMode                       /* One of the INCRINIT_XXX constants */
){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* For looping over PmaReader objects */
  int nTree = pMerger->nTree;

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  /* Verify that the MergeEngine is assigned to a single thread */
  assert( pMerger->pTask==0 );
  pMerger->pTask = pTask;

  for(i=0; i<nTree; i++){
    if( SQLITE_MAX_WORKER_THREADS>0 && eMode==INCRINIT_ROOT ){
      /* PmaReaders should be normally initialized in order, as if they are
      ** reading from the same temp file this makes for more linear file IO.
      ** However, in the INCRINIT_ROOT case, if PmaReader aReadr[nTask-1] is
      ** in use it will block the vdbePmaReaderNext() call while it uses
      ** the main thread to fill its buffer. So calling PmaReaderNext()
      ** on this PmaReader before any of the multi-threaded PmaReaders takes
      ** better advantage of multi-processor hardware. */
      rc = vdbePmaReaderNext(&pMerger->aReadr[nTree-i-1]);
    }else{
      rc = vdbePmaReaderIncrInit(&pMerger->aReadr[i], INCRINIT_NORMAL);
    }
    if( rc!=SQLITE_OK ) return rc;
  }

  for(i=pMerger->nTree-1; i>0; i--){
    vdbeMergeEngineCompare(pMerger, i);
  }
  return pTask->pUnpacked->errCode;
}